

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

void do_connect(uv_loop_t *loop,uv_tcp_t *tcp_client)

{
  uv_loop_t *puVar1;
  int iVar2;
  int iVar3;
  undefined8 *extraout_RDX;
  uv_tcp_t *puVar4;
  uv_tcp_t *puVar5;
  uv_stream_t *server;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  void *pvStack_88;
  undefined1 auStack_80 [16];
  undefined1 auStack_70 [16];
  uv__queue *puStack_60;
  undefined1 auStack_58 [16];
  uv__queue *puStack_48;
  undefined1 auStack_40 [16];
  uv__queue *puStack_30;
  undefined1 local_28 [32];
  
  puStack_30 = (uv__queue *)0x1c54a1;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(local_28 + 0x10));
  local_28._8_8_ = SEXT48(iVar2);
  local_28._0_8_ = (uv_connect_t *)0x0;
  if ((uv_loop_t *)local_28._8_8_ == (uv_loop_t *)0x0) {
    puStack_30 = (uv__queue *)0x1c54ca;
    iVar2 = uv_tcp_init(loop,&::tcp_client);
    local_28._8_8_ = SEXT48(iVar2);
    local_28._0_8_ = (uv_connect_t *)0x0;
    if ((uv_loop_t *)local_28._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5530;
    puStack_30 = (uv__queue *)0x1c5503;
    iVar2 = uv_tcp_connect(&connect_req,&::tcp_client,(sockaddr *)(local_28 + 0x10),connect_cb);
    local_28._8_8_ = SEXT48(iVar2);
    local_28._0_8_ = (uv_connect_t *)0x0;
    if ((uv_loop_t *)local_28._8_8_ == (uv_loop_t *)0x0) {
      return;
    }
  }
  else {
    puStack_30 = (uv__queue *)0x1c5530;
    do_connect_cold_1();
LAB_001c5530:
    puStack_30 = (uv__queue *)0x1c553d;
    do_connect_cold_2();
  }
  puVar4 = (uv_tcp_t *)local_28;
  puStack_30 = (uv__queue *)run_test_tcp_close_reset_client_after_shutdown;
  do_connect_cold_3();
  puVar5 = (uv_tcp_t *)auStack_40;
  puStack_48 = (uv__queue *)0x1c5554;
  puStack_30 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  puStack_48 = (uv__queue *)0x1c5563;
  start_server(::loop,puVar4);
  client_close = 1;
  shutdown_before_close = 1;
  puStack_48 = (uv__queue *)0x1c5580;
  do_connect(::loop,puVar4);
  auStack_40._8_8_ = SEXT48(write_cb_called);
  auStack_40._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_40._8_8_ == (uv_loop_t *)0x0) {
    auStack_40._8_8_ = SEXT48(close_cb_called);
    auStack_40._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_40._8_8_ != (uv_loop_t *)0x0) goto LAB_001c56e0;
    auStack_40._8_8_ = SEXT48(shutdown_cb_called);
    auStack_40._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_40._8_8_ != (uv_loop_t *)0x0) goto LAB_001c56ed;
    puStack_48 = (uv__queue *)0x1c55f7;
    iVar2 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar1 = ::loop;
    auStack_40._8_8_ = SEXT48(iVar2);
    auStack_40._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_40._8_8_ != (uv_loop_t *)0x0) goto LAB_001c56fa;
    auStack_40._8_8_ = (uv_loop_t *)0x4;
    auStack_40._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_40._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5707;
    auStack_40._8_8_ = SEXT48(close_cb_called);
    auStack_40._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_40._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5714;
    auStack_40._8_8_ = (uv_loop_t *)0x1;
    auStack_40._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_40._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5721;
    puStack_48 = (uv__queue *)0x1c5696;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_48 = (uv__queue *)0x1c56a0;
    uv_run(puVar1,UV_RUN_DEFAULT);
    auStack_40._8_8_ = (uv_loop_t *)0x0;
    puStack_48 = (uv__queue *)0x1c56b5;
    iVar2 = uv_loop_close(::loop);
    auStack_40._0_8_ = SEXT48(iVar2);
    loop = puVar1;
    if (auStack_40._8_8_ == auStack_40._0_8_) {
      puStack_48 = (uv__queue *)0x1c56cb;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_48 = (uv__queue *)0x1c56e0;
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_001c56e0:
    puStack_48 = (uv__queue *)0x1c56ed;
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_001c56ed:
    puStack_48 = (uv__queue *)0x1c56fa;
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_001c56fa:
    puStack_48 = (uv__queue *)0x1c5707;
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_001c5707:
    puStack_48 = (uv__queue *)0x1c5714;
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_001c5714:
    puStack_48 = (uv__queue *)0x1c5721;
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_001c5721:
    puStack_48 = (uv__queue *)0x1c572e;
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  puStack_48 = (uv__queue *)run_test_tcp_close_reset_accepted;
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  puVar4 = (uv_tcp_t *)auStack_58;
  puStack_60 = (uv__queue *)0x1c5745;
  puStack_48 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  puStack_60 = (uv__queue *)0x1c5754;
  start_server(::loop,puVar5);
  client_close = 0;
  shutdown_before_close = 0;
  puStack_60 = (uv__queue *)0x1c5771;
  do_connect(::loop,puVar5);
  auStack_58._8_8_ = SEXT48(write_cb_called);
  auStack_58._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_58._8_8_ == (uv_loop_t *)0x0) {
    auStack_58._8_8_ = SEXT48(close_cb_called);
    auStack_58._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_58._8_8_ != (uv_loop_t *)0x0) goto LAB_001c58d1;
    auStack_58._8_8_ = SEXT48(shutdown_cb_called);
    auStack_58._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_58._8_8_ != (uv_loop_t *)0x0) goto LAB_001c58de;
    puStack_60 = (uv__queue *)0x1c57e8;
    iVar2 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar1 = ::loop;
    auStack_58._8_8_ = SEXT48(iVar2);
    auStack_58._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_58._8_8_ != (uv_loop_t *)0x0) goto LAB_001c58eb;
    auStack_58._8_8_ = (uv_loop_t *)0x4;
    auStack_58._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_58._0_8_ != (uv_loop_t *)0x4) goto LAB_001c58f8;
    auStack_58._8_8_ = (uv_loop_t *)0x1;
    auStack_58._0_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_58._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5905;
    auStack_58._8_8_ = SEXT48(shutdown_cb_called);
    auStack_58._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_58._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5912;
    puStack_60 = (uv__queue *)0x1c5887;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_60 = (uv__queue *)0x1c5891;
    uv_run(puVar1,UV_RUN_DEFAULT);
    auStack_58._8_8_ = (uv_loop_t *)0x0;
    puStack_60 = (uv__queue *)0x1c58a6;
    iVar2 = uv_loop_close(::loop);
    auStack_58._0_8_ = SEXT48(iVar2);
    loop = puVar1;
    if (auStack_58._8_8_ == auStack_58._0_8_) {
      puStack_60 = (uv__queue *)0x1c58bc;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_60 = (uv__queue *)0x1c58d1;
    run_test_tcp_close_reset_accepted_cold_1();
LAB_001c58d1:
    puStack_60 = (uv__queue *)0x1c58de;
    run_test_tcp_close_reset_accepted_cold_2();
LAB_001c58de:
    puStack_60 = (uv__queue *)0x1c58eb;
    run_test_tcp_close_reset_accepted_cold_3();
LAB_001c58eb:
    puStack_60 = (uv__queue *)0x1c58f8;
    run_test_tcp_close_reset_accepted_cold_4();
LAB_001c58f8:
    puStack_60 = (uv__queue *)0x1c5905;
    run_test_tcp_close_reset_accepted_cold_5();
LAB_001c5905:
    puStack_60 = (uv__queue *)0x1c5912;
    run_test_tcp_close_reset_accepted_cold_6();
LAB_001c5912:
    puStack_60 = (uv__queue *)0x1c591f;
    run_test_tcp_close_reset_accepted_cold_7();
  }
  puStack_60 = (uv__queue *)run_test_tcp_close_reset_accepted_after_shutdown;
  run_test_tcp_close_reset_accepted_cold_8();
  puVar5 = (uv_tcp_t *)auStack_70;
  auStack_80._8_8_ = (uv_loop_t *)0x1c5936;
  puStack_60 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  auStack_80._8_8_ = (uv_loop_t *)0x1c5945;
  start_server(::loop,puVar4);
  client_close = 0;
  shutdown_before_close = 1;
  auStack_80._8_8_ = (uv_loop_t *)0x1c5962;
  do_connect(::loop,puVar4);
  auStack_70._8_8_ = SEXT48(write_cb_called);
  auStack_70._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_70._8_8_ == (uv_loop_t *)0x0) {
    auStack_70._8_8_ = SEXT48(close_cb_called);
    auStack_70._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_70._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5ac2;
    auStack_70._8_8_ = SEXT48(shutdown_cb_called);
    auStack_70._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_70._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5acf;
    auStack_80._8_8_ = (uv_loop_t *)0x1c59d9;
    iVar2 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar1 = ::loop;
    auStack_70._8_8_ = SEXT48(iVar2);
    auStack_70._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_70._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5adc;
    auStack_70._8_8_ = (uv_loop_t *)0x4;
    auStack_70._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_70._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5ae9;
    auStack_70._8_8_ = SEXT48(close_cb_called);
    auStack_70._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_70._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5af6;
    auStack_70._8_8_ = (uv_loop_t *)0x1;
    auStack_70._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_70._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5b03;
    auStack_80._8_8_ = (uv_loop_t *)0x1c5a78;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    auStack_80._8_8_ = (uv_loop_t *)0x1c5a82;
    uv_run(puVar1,UV_RUN_DEFAULT);
    auStack_70._8_8_ = (uv_loop_t *)0x0;
    auStack_80._8_8_ = (uv_loop_t *)0x1c5a97;
    iVar2 = uv_loop_close(::loop);
    auStack_70._0_8_ = SEXT48(iVar2);
    loop = puVar1;
    if (auStack_70._8_8_ == auStack_70._0_8_) {
      auStack_80._8_8_ = (uv_loop_t *)0x1c5aad;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStack_80._8_8_ = (uv_loop_t *)0x1c5ac2;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_001c5ac2:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5acf;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_001c5acf:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5adc;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_001c5adc:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5ae9;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_001c5ae9:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5af6;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_001c5af6:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5b03;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_001c5b03:
    auStack_80._8_8_ = (uv_loop_t *)0x1c5b10;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  auStack_80._8_8_ = run_test_tcp_close_reset_accepted_after_socket_shutdown;
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  iVar2 = (int)&pvStack_88;
  auStack_80._8_8_ = loop;
  ::loop = uv_default_loop();
  start_server(::loop,puVar5);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(::loop,puVar5);
  auStack_80._0_8_ = SEXT48(write_cb_called);
  pvStack_88 = (void *)0x0;
  if ((void *)auStack_80._0_8_ == (void *)0x0) {
    auStack_80._0_8_ = SEXT48(close_cb_called);
    pvStack_88 = (void *)0x0;
    if ((void *)auStack_80._0_8_ != (void *)0x0) goto LAB_001c5cb3;
    auStack_80._0_8_ = SEXT48(shutdown_cb_called);
    pvStack_88 = (void *)0x0;
    if ((void *)auStack_80._0_8_ != (void *)0x0) goto LAB_001c5cc0;
    iVar3 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar1 = ::loop;
    auStack_80._0_8_ = SEXT48(iVar3);
    pvStack_88 = (void *)0x0;
    if ((void *)auStack_80._0_8_ != (void *)0x0) goto LAB_001c5ccd;
    auStack_80._0_8_ = (void *)0x4;
    pvStack_88 = (void *)(long)write_cb_called;
    if (pvStack_88 != (void *)0x4) goto LAB_001c5cda;
    auStack_80._0_8_ = (void *)0x1;
    pvStack_88 = (void *)(long)close_cb_called;
    if (pvStack_88 != (void *)0x1) goto LAB_001c5ce7;
    auStack_80._0_8_ = SEXT48(shutdown_cb_called);
    pvStack_88 = (void *)0x0;
    if ((void *)auStack_80._0_8_ != (void *)0x0) goto LAB_001c5cf4;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    uv_run(puVar1,UV_RUN_DEFAULT);
    auStack_80._0_8_ = (void *)0x0;
    iVar3 = uv_loop_close(::loop);
    pvStack_88 = (void *)(long)iVar3;
    if ((void *)auStack_80._0_8_ == pvStack_88) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c5cb3:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c5cc0:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c5ccd:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c5cda:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c5ce7:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c5cf4:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  server = (uv_stream_t *)auStack_80;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(::loop,&tcp_accepted);
    if (iVar2 == 0) {
      iVar2 = uv_accept(server,(uv_stream_t *)&tcp_accepted);
      if (iVar2 == 0) {
        uv_read_start((uv_stream_t *)&tcp_accepted,alloc_cb,read_cb);
        return;
      }
      goto LAB_001c5dc0;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c5dc0:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return;
}

Assistant:

static void do_connect(uv_loop_t* loop, uv_tcp_t* tcp_client) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, tcp_client);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     tcp_client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);
}